

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int inputSize)

{
  uint uVar1;
  BYTE *pBVar2;
  U32 UVar3;
  U32 UVar4;
  U32 UVar5;
  uint uVar6;
  BYTE *pInLimit;
  BYTE *srcBase;
  BYTE *pBVar7;
  char *__n;
  bool bVar8;
  BYTE *local_158;
  BYTE *smallest;
  BYTE *dictEnd;
  int result;
  LZ4_stream_t_internal *streamPtr;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  LZ4_stream_t *LZ4_dict_local;
  size_t accumulator;
  size_t lastRun;
  BYTE *pBStack_100;
  uint more;
  BYTE *limit;
  uint matchLength;
  int len;
  uint litLength;
  U32 h;
  uint searchMatchNb;
  uint step;
  BYTE *forwardIp;
  BYTE *token;
  BYTE *match;
  size_t refDelta;
  U32 forwardH;
  BYTE *olimit;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  size_t dictDelta;
  BYTE *dictEnd_1;
  BYTE *dictionary;
  BYTE *lowRefLimit;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *ip;
  LZ4_stream_t_internal *dictPtr;
  int local_c;
  
  local_158 = (BYTE *)(LZ4_dict->table[0x801] + (ulong)(uint)LZ4_dict->table[0x803]);
  if (source < local_158) {
    local_158 = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_dict,local_158);
  pBVar2 = (BYTE *)LZ4_dict->table[0x801];
  uVar1 = (uint)LZ4_dict->table[0x803];
  pInLimit = (BYTE *)(source + (long)inputSize + -5);
  if ((uint)inputSize < 0x7e000001) {
    srcBase = (BYTE *)(source + -(ulong)(uint)LZ4_dict->table[0x800]);
    olimit = (BYTE *)dest;
    iend = (BYTE *)source;
    if (0xc < inputSize) {
      LZ4_putPosition((BYTE *)source,LZ4_dict,byU32,srcBase);
      base = (BYTE *)(source + 1);
      refDelta._4_4_ = LZ4_hashPosition(base,byU32);
      do {
        _searchMatchNb = base;
        h = 1;
        litLength = 0x40;
        do {
          base = _searchMatchNb;
          pBVar7 = _searchMatchNb + h;
          h = litLength >> 6;
          if (source + (long)inputSize + -0xc < pBVar7) goto LAB_0025d353;
          token = LZ4_getPositionOnHash(refDelta._4_4_,LZ4_dict,byU32,srcBase);
          match = pBVar2 + ((ulong)uVar1 - (long)source);
          lowRefLimit = pBVar2;
          if (source <= token) {
            match = (BYTE *)0x0;
            lowRefLimit = (BYTE *)source;
          }
          UVar3 = LZ4_hashPosition(pBVar7,byU32);
          LZ4_putPositionOnHash(_searchMatchNb,refDelta._4_4_,LZ4_dict,byU32,srcBase);
          bVar8 = true;
          if (_searchMatchNb <= token + 0xffff) {
            UVar4 = LZ4_read32(token + (long)match);
            UVar5 = LZ4_read32(_searchMatchNb);
            bVar8 = UVar4 != UVar5;
          }
          litLength = litLength + 1;
          _searchMatchNb = pBVar7;
          refDelta._4_4_ = UVar3;
        } while (bVar8);
        while( true ) {
          bVar8 = false;
          if ((iend < base) && (bVar8 = false, lowRefLimit < token + (long)match)) {
            bVar8 = base[-1] == token[(long)(match + -1)];
          }
          if (!bVar8) break;
          base = base + -1;
          token = token + -1;
        }
        uVar6 = (int)base - (int)iend;
        forwardIp = olimit;
        if (uVar6 < 0xf) {
          *olimit = (char)uVar6 * '\x10';
          olimit = olimit + 1;
        }
        else {
          *olimit = 0xf0;
          olimit = olimit + 1;
          for (limit._4_4_ = uVar6 - 0xf; 0xfe < limit._4_4_; limit._4_4_ = limit._4_4_ + -0xff) {
            *olimit = 0xff;
            olimit = olimit + 1;
          }
          *olimit = (BYTE)limit._4_4_;
          olimit = olimit + 1;
        }
        LZ4_wildCopy(olimit,iend,olimit + uVar6);
        olimit = olimit + uVar6;
        while( true ) {
          LZ4_writeLE16(olimit,(short)base - (short)token);
          olimit = olimit + 2;
          if (lowRefLimit == pBVar2) {
            pBStack_100 = base + (long)(pBVar2 + ((ulong)uVar1 - (long)(match + (long)token)));
            if (pInLimit < base + (long)(pBVar2 + ((ulong)uVar1 - (long)(match + (long)token)))) {
              pBStack_100 = pInLimit;
            }
            limit._0_4_ = LZ4_count(base + 4,match + (long)token + 4,pBStack_100);
            base = base + ((uint)limit + 4);
            if (base == pBStack_100) {
              uVar6 = LZ4_count(base,(BYTE *)source,pInLimit);
              limit._0_4_ = uVar6 + (uint)limit;
              base = base + uVar6;
            }
          }
          else {
            limit._0_4_ = LZ4_count(base + 4,token + 4,pInLimit);
            base = base + ((uint)limit + 4);
          }
          if ((uint)limit < 0xf) {
            *forwardIp = *forwardIp + (char)(uint)limit;
          }
          else {
            *forwardIp = *forwardIp + '\x0f';
            for (limit._0_4_ = (uint)limit - 0xf; 0x1fd < (uint)limit;
                limit._0_4_ = (uint)limit - 0x1fe) {
              pBVar7 = olimit + 1;
              *olimit = 0xff;
              olimit = olimit + 2;
              *pBVar7 = 0xff;
            }
            if (0xfe < (uint)limit) {
              limit._0_4_ = (uint)limit - 0xff;
              *olimit = 0xff;
              olimit = olimit + 1;
            }
            *olimit = (BYTE)(uint)limit;
            olimit = olimit + 1;
          }
          iend = base;
          if (source + (long)inputSize + -0xc < base) goto LAB_0025d353;
          LZ4_putPosition(base + -2,LZ4_dict,byU32,srcBase);
          token = LZ4_getPosition(base,LZ4_dict,byU32,srcBase);
          match = pBVar2 + ((ulong)uVar1 - (long)source);
          lowRefLimit = pBVar2;
          if (source <= token) {
            match = (BYTE *)0x0;
            lowRefLimit = (BYTE *)source;
          }
          LZ4_putPosition(base,LZ4_dict,byU32,srcBase);
          if (token + 0xffff < base) break;
          UVar3 = LZ4_read32(token + (long)match);
          UVar4 = LZ4_read32(base);
          if (UVar3 != UVar4) break;
          forwardIp = olimit;
          *olimit = '\0';
          olimit = olimit + 1;
        }
        base = base + 1;
        refDelta._4_4_ = LZ4_hashPosition(base,byU32);
      } while( true );
    }
LAB_0025d353:
    __n = source + ((long)inputSize - (long)iend);
    if (__n < (char *)0xf) {
      *olimit = (char)__n * '\x10';
      olimit = olimit + 1;
    }
    else {
      *olimit = 0xf0;
      pBVar2 = olimit;
      for (LZ4_dict_local = (LZ4_stream_t *)(__n + -0xf); olimit = pBVar2 + 1,
          (LZ4_stream_t *)0xfe < LZ4_dict_local;
          LZ4_dict_local = (LZ4_stream_t *)((long)LZ4_dict_local[-1].table + 0x3f21)) {
        *olimit = 0xff;
        pBVar2 = olimit;
      }
      *olimit = (BYTE)LZ4_dict_local;
      olimit = pBVar2 + 2;
    }
    memcpy(olimit,iend,(size_t)__n);
    local_c = ((int)__n + (int)olimit) - (int)dest;
  }
  else {
    local_c = 0;
  }
  LZ4_dict->table[0x801] = (longlong)source;
  *(int *)(LZ4_dict->table + 0x803) = inputSize;
  *(int *)(LZ4_dict->table + 0x800) = inputSize + (int)LZ4_dict->table[0x800];
  return local_c;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int inputSize)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_dict;
    int result;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = dictEnd;
    if (smallest > (const BYTE*) source) smallest = (const BYTE*) source;
    LZ4_renormDictT((LZ4_stream_t_internal*)LZ4_dict, smallest);

    result = LZ4_compress_generic(LZ4_dict, source, dest, inputSize, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)inputSize;
    streamPtr->currentOffset += (U32)inputSize;

    return result;
}